

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O0

void thread_pool::ThreadPool::Task(ThreadPool *thread_pool)

{
  bool bVar1;
  reference __x;
  int local_40;
  undefined1 local_30 [8];
  type task;
  ThreadPool *thread_pool_local;
  
  task._M_invoker = (_Invoker_type)thread_pool;
  do {
    Semaphore::Wait((Semaphore *)(task._M_invoker + 0x50));
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)(task._M_invoker + 0x160));
    if (bVar1) {
      return;
    }
    Semaphore::Wait((Semaphore *)(task._M_invoker + 0x100));
    __x = std::
          queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          ::front((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                   *)(task._M_invoker + 0xb0));
    std::function<void_()>::function((function<void_()> *)local_30,__x);
    std::
    queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::pop((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
           *)(task._M_invoker + 0xb0));
    Semaphore::Signal((Semaphore *)(task._M_invoker + 0x100));
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)(task._M_invoker + 0x160));
    if (bVar1) {
      local_40 = 3;
    }
    else {
      std::function<void_()>::operator()((function<void_()> *)local_30);
      local_40 = 0;
    }
    std::function<void_()>::~function((function<void_()> *)local_30);
  } while (local_40 == 0);
  return;
}

Assistant:

static void Task(ThreadPool* thread_pool) {
    while (true) {
      thread_pool->thread_semaphore_.Wait();

      if (thread_pool->terminate_) {
        break;
      }

      thread_pool->queue_semaphore_.Wait();
      auto task = std::move(thread_pool->queue_.front());
      thread_pool->queue_.pop();
      thread_pool->queue_semaphore_.Signal();

      if (thread_pool->terminate_) {
        break;
      }

      task();
    }
  }